

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int ref_nonsingle(saucy *s,coloring *c,int *adj,int *edg,int cf)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  int *piVar10;
  
  lVar3 = (long)cf;
  iVar7 = c->clen[lVar3];
  if ((long)iVar7 != 0) {
    memcpy(s->junk,c->lab + lVar3,(long)iVar7 * 4 + 4);
    if (-1 < iVar7) {
      uVar6 = 0;
      do {
        lVar5 = (long)s->junk[uVar6];
        iVar9 = adj[lVar5];
        if (iVar9 != adj[lVar5 + 1]) {
          piVar10 = edg + iVar9;
          do {
            iVar4 = *piVar10;
            if ((c->clen[c->cfront[iVar4]] != 0) &&
               (iVar1 = s->ccount[iVar4], s->ccount[iVar4] = iVar1 + 1, iVar1 == 0)) {
              move_to_back(s,c,iVar4);
            }
            piVar10 = piVar10 + 1;
            iVar9 = iVar9 + 1;
          } while (iVar9 != adj[lVar5 + 1]);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != iVar7 + 1);
    }
    iVar9 = refine_cell(s,c,ref_nonsingle_cell);
    if (-1 < iVar7) {
      piVar10 = c->lab;
      iVar4 = iVar7 + cf;
      if (iVar7 + cf < cf) {
        iVar4 = cf;
      }
      do {
        lVar5 = (long)piVar10[lVar3];
        iVar7 = adj[lVar5];
        if (iVar7 != adj[lVar5 + 1]) {
          piVar2 = s->ccount;
          piVar8 = edg + iVar7;
          do {
            piVar2[*piVar8] = 0;
            piVar8 = piVar8 + 1;
            iVar7 = iVar7 + 1;
          } while (iVar7 != adj[lVar5 + 1]);
        }
        lVar3 = lVar3 + 1;
      } while (iVar4 + 1 != (int)lVar3);
    }
    return iVar9;
  }
  iVar7 = ref_singleton(s,c,adj,edg,cf);
  return iVar7;
}

Assistant:

static int
ref_nonsingle(struct saucy *s, struct coloring *c,
    const int *adj, const int *edg, int cf)
{
    int i, j, k, ret;
    const int cb = cf + c->clen[cf];
    const int size = cb - cf + 1;

    /* Double check for nonsingles which became singles later */
    if (cf == cb) {
        return ref_singleton(s, c, adj, edg, cf);
    }

    /* Establish connected list */
    memcpy(s->junk, c->lab + cf, size * sizeof(int));
    for (i = 0; i < size; ++i) {
        k = s->junk[i];
        for (j = adj[k]; j != adj[k+1]; ++j) {
            data_count(s, c, edg[j]);
        }
    }

    /* Refine the cells we're connected to */
    ret = refine_cell(s, c, ref_nonsingle_cell);

    /* Clear the counts; use lab because junk was overwritten */
    for (i = cf; i <= cb; ++i) {
        k = c->lab[i];
        for (j = adj[k]; j != adj[k+1]; ++j) {
            s->ccount[edg[j]] = 0;
        }
    }

    return ret;
}